

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Name> *
wasm::WATParser::dataidx<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Name> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  Lexer *this;
  optional<unsigned_int> oVar1;
  string local_70;
  undefined1 local_50 [8];
  optional<wasm::Name> id;
  allocator<char> local_29;
  
  this = &ctx->in;
  oVar1 = Lexer::takeU<unsigned_int>(this);
  if (((ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
    Lexer::takeID((optional<wasm::Name> *)local_50,this);
    if (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\x01') {
      ParseDefsCtx::getDataFromName(__return_storage_ptr__,ctx,_local_50);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"expected data index or identifier",&local_29);
      Lexer::err((Err *)local_50,this,&local_70);
      std::__detail::__variant::_Variant_storage<false,wasm::Name,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Name,wasm::Err> *)__return_storage_ptr__,local_50);
      std::__cxx11::string::~string((string *)local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  else {
    ParseDefsCtx::getDataFromIdx
              (__return_storage_ptr__,ctx,
               oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::DataIdxT> dataidx(Ctx& ctx) {
  if (auto x = ctx.in.takeU32()) {
    return ctx.getDataFromIdx(*x);
  }
  if (auto id = ctx.in.takeID()) {
    return ctx.getDataFromName(*id);
  }
  return ctx.in.err("expected data index or identifier");
}